

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

void __thiscall basisu::priority_queue::down_heap(priority_queue *this,uint32_t heap_index)

{
  float fVar1;
  entry *peVar2;
  uint in_ESI;
  long in_RDI;
  uint32_t child_index;
  float orig_priority;
  uint32_t orig_index;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  float fVar4;
  vector<basisu::priority_queue::entry> *in_stack_ffffffffffffffd0;
  uint local_18;
  uint local_c;
  
  peVar2 = vector<basisu::priority_queue::entry>::operator[]
                     (in_stack_ffffffffffffffd0,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar3 = peVar2->m_index;
  peVar2 = vector<basisu::priority_queue::entry>::operator[]
                     (in_stack_ffffffffffffffd0,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  fVar4 = peVar2->m_priority;
  local_c = in_ESI;
  while (local_18 = local_c * 2, local_18 <= *(uint *)(in_RDI + 0x10)) {
    if (local_18 < *(uint *)(in_RDI + 0x10)) {
      peVar2 = vector<basisu::priority_queue::entry>::operator[]
                         (in_stack_ffffffffffffffd0,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      fVar1 = peVar2->m_priority;
      peVar2 = vector<basisu::priority_queue::entry>::operator[]
                         (in_stack_ffffffffffffffd0,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (fVar1 < peVar2->m_priority) {
        local_18 = local_18 + 1;
      }
    }
    peVar2 = vector<basisu::priority_queue::entry>::operator[]
                       (in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (peVar2->m_priority <= fVar4 && fVar4 != peVar2->m_priority) break;
    in_stack_ffffffffffffffd0 =
         (vector<basisu::priority_queue::entry> *)
         vector<basisu::priority_queue::entry>::operator[]
                   (in_stack_ffffffffffffffd0,
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    peVar2 = vector<basisu::priority_queue::entry>::operator[]
                       (in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *peVar2 = (entry)in_stack_ffffffffffffffd0->m_p;
    local_c = local_18;
  }
  peVar2 = vector<basisu::priority_queue::entry>::operator[]
                     (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,uVar3));
  peVar2->m_index = uVar3;
  peVar2 = vector<basisu::priority_queue::entry>::operator[]
                     (in_stack_ffffffffffffffd0,CONCAT44(fVar4,uVar3));
  peVar2->m_priority = fVar4;
  return;
}

Assistant:

inline void down_heap(uint32_t heap_index)
		{
			uint32_t orig_index = m_heap[heap_index].m_index;
			const float orig_priority = m_heap[heap_index].m_priority;

			uint32_t child_index;
			while ((child_index = (heap_index << 1)) <= m_size)
			{
				if ((child_index < m_size) && (m_heap[child_index].m_priority < m_heap[child_index + 1].m_priority)) ++child_index;
				if (orig_priority > m_heap[child_index].m_priority)
					break;
				m_heap[heap_index] = m_heap[child_index];
				heap_index = child_index;
			}

			m_heap[heap_index].m_index = orig_index;
			m_heap[heap_index].m_priority = orig_priority;
		}